

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema_compile_amend.c
# Opt level: O1

LY_ERR lys_precompile_own_augments_mod(lysc_ctx *ctx,lysp_module *pmod)

{
  lysp_ext_instance *plVar1;
  lysp_ext_substmt *plVar2;
  lysp_ext_substmt *plVar3;
  LY_ERR LVar4;
  lysp_ext_instance *plVar5;
  void **ppvVar6;
  lysp_node_augment *plVar7;
  lysp_ext_substmt *plVar8;
  void **ppvVar9;
  lysp_ext_instance *plVar10;
  
  for (plVar7 = pmod->augments; plVar7 != (lysp_node_augment *)0x0;
      plVar7 = (plVar7->field_0).field_1.next) {
    LVar4 = lys_precompile_own_augment(ctx,plVar7,pmod,(lysp_ext_instance *)0x0);
    if (LVar4 != LY_SUCCESS) {
      return LVar4;
    }
  }
  plVar10 = (lysp_ext_instance *)0x0;
  do {
    plVar1 = pmod->exts;
    if (plVar1 == (lysp_ext_instance *)0x0) {
      plVar5 = (lysp_ext_instance *)0x0;
    }
    else {
      plVar5 = plVar1[-1].exts;
    }
    if (plVar5 <= plVar10) {
      return LY_SUCCESS;
    }
    plVar2 = plVar1[(long)plVar10].substmts;
    ppvVar6 = (void **)0xffffffffffffffff;
    plVar3 = plVar2;
    do {
      plVar8 = plVar3;
      if (plVar2 == (lysp_ext_substmt *)0x0) {
        ppvVar9 = (void **)0x0;
      }
      else {
        ppvVar9 = plVar2[-1].storage_p;
      }
      ppvVar6 = (void **)((long)ppvVar6 + 1);
      if (ppvVar9 <= ppvVar6) {
        plVar7 = (lysp_node_augment *)0x0;
        goto LAB_0015340e;
      }
      plVar3 = plVar8 + 1;
    } while (plVar8->stmt != LY_STMT_AUGMENT);
    plVar7 = (lysp_node_augment *)*plVar8->storage_p;
LAB_0015340e:
    if ((plVar7 != (lysp_node_augment *)0x0) &&
       (LVar4 = lys_precompile_own_augment(ctx,plVar7,pmod,plVar1 + (long)plVar10),
       LVar4 != LY_SUCCESS)) {
      return LVar4;
    }
    plVar10 = (lysp_ext_instance *)((long)&plVar10->name + 1);
  } while( true );
}

Assistant:

static LY_ERR
lys_precompile_own_augments_mod(struct lysc_ctx *ctx, const struct lysp_module *pmod)
{
    LY_ARRAY_COUNT_TYPE u, v;
    struct lysp_node_augment *aug_p;

    /* module */
    LY_LIST_FOR(pmod->augments, aug_p) {
        LY_CHECK_RET(lys_precompile_own_augment(ctx, aug_p, pmod, NULL));
    }

    /* parsed extension instances */
    LY_ARRAY_FOR(pmod->exts, u) {
        aug_p = NULL;
        LY_ARRAY_FOR(pmod->exts[u].substmts, v) {
            if (pmod->exts[u].substmts[v].stmt == LY_STMT_AUGMENT) {
                aug_p = *(pmod->exts[u].substmts[v].storage_p);
                break;
            }
        }
        if (!aug_p) {
            continue;
        }

        LY_CHECK_RET(lys_precompile_own_augment(ctx, aug_p, pmod, &pmod->exts[u]));
    }

    return LY_SUCCESS;
}